

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int x509_parse_time(uchar **p,size_t len,size_t yearlen,mbedtls_x509_time *time)

{
  ulong uVar1;
  int ret;
  mbedtls_x509_time *time_local;
  size_t yearlen_local;
  size_t len_local;
  uchar **p_local;
  
  if (len < yearlen + 8) {
    p_local._4_4_ = -0x2400;
  }
  else {
    uVar1 = len - (yearlen + 8);
    p_local._4_4_ = x509_parse_int(p,yearlen,&time->year);
    if (p_local._4_4_ == 0) {
      if (yearlen == 2) {
        if (time->year < 0x32) {
          time->year = time->year + 100;
        }
        time->year = time->year + 0x76c;
      }
      p_local._4_4_ = x509_parse_int(p,2,&time->mon);
      if ((((p_local._4_4_ == 0) &&
           (p_local._4_4_ = x509_parse_int(p,2,&time->day), p_local._4_4_ == 0)) &&
          (p_local._4_4_ = x509_parse_int(p,2,&time->hour), p_local._4_4_ == 0)) &&
         (p_local._4_4_ = x509_parse_int(p,2,&time->min), p_local._4_4_ == 0)) {
        if (uVar1 < 2) {
          p_local._4_4_ = -0x2400;
        }
        else {
          p_local._4_4_ = x509_parse_int(p,2,&time->sec);
          if (p_local._4_4_ == 0) {
            yearlen_local = uVar1 - 2;
            if ((yearlen_local == 1) && (**p == 'Z')) {
              *p = *p + 1;
              yearlen_local = uVar1 - 3;
            }
            if (yearlen_local == 0) {
              p_local._4_4_ = x509_date_is_valid(time);
              if (p_local._4_4_ == 0) {
                p_local._4_4_ = 0;
              }
            }
            else {
              p_local._4_4_ = -0x2400;
            }
          }
        }
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

static int x509_parse_time( unsigned char **p, size_t len, size_t yearlen,
        mbedtls_x509_time *time )
{
    int ret;

    /*
     * Minimum length is 10 or 12 depending on yearlen
     */
    if ( len < yearlen + 8 )
        return ( MBEDTLS_ERR_X509_INVALID_DATE );
    len -= yearlen + 8;

    /*
     * Parse year, month, day, hour, minute
     */
    CHECK( x509_parse_int( p, yearlen, &time->year ) );
    if ( 2 == yearlen )
    {
        if ( time->year < 50 )
            time->year += 100;

        time->year += 1900;
    }

    CHECK( x509_parse_int( p, 2, &time->mon ) );
    CHECK( x509_parse_int( p, 2, &time->day ) );
    CHECK( x509_parse_int( p, 2, &time->hour ) );
    CHECK( x509_parse_int( p, 2, &time->min ) );

    /*
     * Parse seconds if present
     */
    if ( len >= 2 )
    {
        CHECK( x509_parse_int( p, 2, &time->sec ) );
        len -= 2;
    }
    else
        return ( MBEDTLS_ERR_X509_INVALID_DATE );

    /*
     * Parse trailing 'Z' if present
     */
    if ( 1 == len && 'Z' == **p )
    {
        (*p)++;
        len--;
    }

    /*
     * We should have parsed all characters at this point
     */
    if ( 0 != len )
        return ( MBEDTLS_ERR_X509_INVALID_DATE );

    CHECK( x509_date_is_valid( time ) );

    return ( 0 );
}